

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O3

void __thiscall
TorController::protocolinfo_cb
          (TorController *this,TorControlConnection *_conn,TorControlReply *reply)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr *pp_Var2;
  pointer pbVar3;
  pointer puVar4;
  bool bVar5;
  int iVar6;
  iterator iVar7;
  Logger *pLVar8;
  _Base_ptr p_Var9;
  const_iterator cVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  char *fmt;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  char *in_R8;
  pointer s;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s_00;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  Span<unsigned_char> bytes;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view separators;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  string torpassword;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Stack_108;
  size_t local_100;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  l;
  string cookiefile;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (reply->code != 0xfa) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file_02._M_len = 0x5e;
      logging_function_02._M_str = "protocolinfo_cb";
      logging_function_02._M_len = 0xf;
      LogPrintFormatInternal<>
                (logging_function_02,source_file_02,0x265,ALL,Info,
                 (ConstevalFormatString<0U>)0xfaf0c0);
      return;
    }
    goto LAB_00ab1b79;
  }
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  cookiefile._M_dataplus._M_p = (pointer)&cookiefile.field_2;
  cookiefile._M_string_length = 0;
  cookiefile.field_2._M_local_buf[0] = '\0';
  s = (reply->lines).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (reply->lines).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  if (s != pbVar3) {
    do {
      SplitTorReplyLine(&l,s);
      iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&l.first,"AUTH");
      if (iVar6 == 0) {
        ParseTorReplyMapping
                  ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&m._M_t,&l.second);
        local_128._0_8_ = local_118;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"METHODS","");
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&m._M_t,(key_type *)local_128);
        if ((undefined1 *)local_128._0_8_ != local_118) {
          operator_delete((void *)local_128._0_8_,(ulong)(local_118._0_8_ + 1));
        }
        if ((_Rb_tree_header *)iVar7._M_node != &m._M_t._M_impl.super__Rb_tree_header) {
          local_128._0_8_ = *(undefined8 *)(iVar7._M_node + 2);
          local_128._8_8_ = iVar7._M_node[2]._M_parent;
          local_168._M_pod_data[0] = 0x2c;
          separators._M_str = in_R8;
          separators._M_len = (size_t)&local_168;
          util::Split<std::__cxx11::string>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&torpassword,(util *)local_128,(Span<const_char> *)0x1,separators);
          std::
          set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::
          set<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_128,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )torpassword._M_dataplus._M_p,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )torpassword._M_string_length);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&local_68);
          if ((code *)local_118._0_8_ != (code *)0x0) {
            local_68._M_impl.super__Rb_tree_header._M_header._M_color = local_128._8_4_;
            local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_118._0_8_;
            local_68._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_118._8_8_;
            local_68._M_impl.super__Rb_tree_header._M_header._M_right =
                 (_Base_ptr)_Stack_108._M_head_impl;
            *(_Rb_tree_header **)(local_118._0_8_ + 8) = &local_68._M_impl.super__Rb_tree_header;
            local_68._M_impl.super__Rb_tree_header._M_node_count = local_100;
            local_118._0_8_ = (code *)0x0;
            local_118._8_8_ = local_128 + 8;
            local_100 = 0;
            _Stack_108._M_head_impl = (_Impl *)local_118._8_8_;
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_128);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&torpassword);
        }
        local_128._0_8_ = local_118;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"COOKIEFILE","");
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&m._M_t,(key_type *)local_128);
        if ((undefined1 *)local_128._0_8_ != local_118) {
          operator_delete((void *)local_128._0_8_,(ulong)(local_118._0_8_ + 1));
        }
        if ((_Rb_tree_header *)iVar7._M_node != &m._M_t._M_impl.super__Rb_tree_header) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&cookiefile,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (iVar7._M_node + 2));
        }
LAB_00ab0ced:
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&m._M_t);
      }
      else {
        iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&l.first,"VERSION");
        if (iVar6 == 0) {
          ParseTorReplyMapping
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&m._M_t,&l.second);
          local_128._0_8_ = local_118;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"Tor","");
          iVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find(&m._M_t,(key_type *)local_128);
          if ((undefined1 *)local_128._0_8_ != local_118) {
            operator_delete((void *)local_128._0_8_,(ulong)(local_118._0_8_ + 1));
          }
          if ((_Rb_tree_header *)iVar7._M_node != &m._M_t._M_impl.super__Rb_tree_header) {
            pLVar8 = LogInstance();
            bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar8,TOR,Debug);
            if (bVar5) {
              in_R8 = (char *)0x236;
              source_file._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
              ;
              source_file._M_len = 0x5e;
              logging_function._M_str = "protocolinfo_cb";
              logging_function._M_len = 0xf;
              LogPrintFormatInternal<std::__cxx11::string>
                        (logging_function,source_file,0x236,TOR,Debug,
                         (ConstevalFormatString<1U>)0xfaee23,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (iVar7._M_node + 2));
            }
          }
          goto LAB_00ab0ced;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)l.second._M_dataplus._M_p != &l.second.field_2) {
        operator_delete(l.second._M_dataplus._M_p,l.second.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)l.first._M_dataplus._M_p != &l.first.field_2) {
        operator_delete(l.first._M_dataplus._M_p,l.first.field_2._M_allocated_capacity + 1);
      }
      s = s + 1;
    } while (s != pbVar3);
    p_Var9 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_68._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_68._M_impl.super__Rb_tree_header) {
      do {
        pLVar8 = LogInstance();
        bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar8,TOR,Debug);
        if (bVar5) {
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
          ;
          source_file_00._M_len = 0x5e;
          logging_function_00._M_str = "protocolinfo_cb";
          logging_function_00._M_len = 0xf;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function_00,source_file_00,0x23b,TOR,Debug,
                     (ConstevalFormatString<1U>)0xfaee40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var9 + 1));
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != &local_68._M_impl.super__Rb_tree_header);
    }
  }
  paVar1 = &l.first.field_2;
  l.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&l,"-torpassword","");
  pp_Var2 = &m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  m._M_t._M_impl._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&m,"");
  ArgsManager::GetArg(&torpassword,&gArgs,&l.first,(string *)&m);
  if ((_Base_ptr *)m._M_t._M_impl._0_8_ != pp_Var2) {
    operator_delete((void *)m._M_t._M_impl._0_8_,
                    (ulong)((long)&(m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)l.first._M_dataplus._M_p != paVar1) {
    operator_delete(l.first._M_dataplus._M_p,l.first.field_2._M_allocated_capacity + 1);
  }
  if (torpassword._M_string_length == 0) {
    l.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&l,"NULL","");
    cVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&local_68,&l.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)l.first._M_dataplus._M_p != paVar1) {
      operator_delete(l.first._M_dataplus._M_p,l.first.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar10._M_node == &local_68._M_impl.super__Rb_tree_header) {
      l.first._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&l,"SAFECOOKIE","");
      cVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&local_68,&l.first);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)l.first._M_dataplus._M_p != paVar1) {
        operator_delete(l.first._M_dataplus._M_p,l.first.field_2._M_allocated_capacity + 1);
      }
      if ((_Rb_tree_header *)cVar10._M_node == &local_68._M_impl.super__Rb_tree_header) {
        l.first._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&l,"HASHEDPASSWORD","");
        cVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_68,&l.first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)l.first._M_dataplus._M_p != paVar1) {
          operator_delete(l.first._M_dataplus._M_p,l.first.field_2._M_allocated_capacity + 1);
        }
        bVar5 = (_Rb_tree_header *)cVar10._M_node == &local_68._M_impl.super__Rb_tree_header;
        iVar6 = bVar5 + 0x260 + (uint)bVar5;
        fmt = 
        "tor: The only supported authentication mechanism left is password, but no password provided with -torpassword\n"
        ;
        if (bVar5) {
          fmt = "tor: No supported authentication method\n";
        }
        goto LAB_00ab1213;
      }
      pLVar8 = LogInstance();
      bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar8,TOR,Debug);
      if (bVar5) {
        source_file_05._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
        ;
        source_file_05._M_len = 0x5e;
        logging_function_05._M_str = "protocolinfo_cb";
        logging_function_05._M_len = 0xf;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_05,source_file_05,0x250,TOR,Debug,
                   (ConstevalFormatString<1U>)0xfaef2c,&cookiefile);
      }
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)&l,&cookiefile,auto_format);
      std::filesystem::__cxx11::path::path((path *)local_128,(path *)&l);
      std::filesystem::__cxx11::path::~path((path *)&l);
      ReadBinaryFile_abi_cxx11_
                ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&m,(path *)local_128,0x20);
      std::filesystem::__cxx11::path::~path((path *)local_128);
      if (m._M_t._M_impl._0_1_ == '\x01') {
        if (m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x20) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&l,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )m._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
                     (char *)(m._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x20),
                     (allocator_type *)local_128);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                    (&this->cookie,&l);
          if (l.first._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(l.first._M_dataplus._M_p,
                            l.first.field_2._M_allocated_capacity - (long)l.first._M_dataplus._M_p);
          }
          l.first._M_dataplus._M_p = (pointer)0x0;
          l.first._M_string_length = 0;
          l.first.field_2._M_allocated_capacity = 0;
          l.first._M_dataplus._M_p = (pointer)operator_new(0x20);
          l.first._M_string_length = (size_type)(l.first._M_dataplus._M_p + 0x20);
          l.first._M_dataplus._M_p[0x10] = '\0';
          l.first._M_dataplus._M_p[0x11] = '\0';
          l.first._M_dataplus._M_p[0x12] = '\0';
          l.first._M_dataplus._M_p[0x13] = '\0';
          l.first._M_dataplus._M_p[0x14] = '\0';
          l.first._M_dataplus._M_p[0x15] = '\0';
          l.first._M_dataplus._M_p[0x16] = '\0';
          l.first._M_dataplus._M_p[0x17] = '\0';
          l.first._M_dataplus._M_p[0x18] = '\0';
          l.first._M_dataplus._M_p[0x19] = '\0';
          l.first._M_dataplus._M_p[0x1a] = '\0';
          l.first._M_dataplus._M_p[0x1b] = '\0';
          l.first._M_dataplus._M_p[0x1c] = '\0';
          l.first._M_dataplus._M_p[0x1d] = '\0';
          l.first._M_dataplus._M_p[0x1e] = '\0';
          l.first._M_dataplus._M_p[0x1f] = '\0';
          l.first._M_dataplus._M_p[0] = '\0';
          l.first._M_dataplus._M_p[1] = '\0';
          l.first._M_dataplus._M_p[2] = '\0';
          l.first._M_dataplus._M_p[3] = '\0';
          l.first._M_dataplus._M_p[4] = '\0';
          l.first._M_dataplus._M_p[5] = '\0';
          l.first._M_dataplus._M_p[6] = '\0';
          l.first._M_dataplus._M_p[7] = '\0';
          l.first._M_dataplus._M_p[8] = '\0';
          l.first._M_dataplus._M_p[9] = '\0';
          l.first._M_dataplus._M_p[10] = '\0';
          l.first._M_dataplus._M_p[0xb] = '\0';
          l.first._M_dataplus._M_p[0xc] = '\0';
          l.first._M_dataplus._M_p[0xd] = '\0';
          l.first._M_dataplus._M_p[0xe] = '\0';
          l.first._M_dataplus._M_p[0xf] = '\0';
          l.first.field_2._M_allocated_capacity = l.first._M_string_length;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                    (&this->clientNonce,&l);
          if (l.first._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(l.first._M_dataplus._M_p,
                            l.first.field_2._M_allocated_capacity - (long)l.first._M_dataplus._M_p);
          }
          puVar4 = (this->clientNonce).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          bytes.m_size = (long)(this->clientNonce).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar4;
          bytes.m_data = puVar4;
          GetRandBytes(bytes);
          puVar4 = (this->clientNonce).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          s_00.m_size = (long)(this->clientNonce).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar4;
          s_00.m_data = puVar4;
          HexStr_abi_cxx11_((string *)local_128,s_00);
          std::operator+(&l.first,"AUTHCHALLENGE SAFECOOKIE ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128);
          local_168._8_8_ = 0;
          local_168._M_unused._M_object = operator_new(0x18);
          *(code **)local_168._M_unused._0_8_ = authchallenge_cb;
          *(undefined8 *)((long)local_168._M_unused._0_8_ + 8) = 0;
          *(TorController **)((long)local_168._M_unused._0_8_ + 0x10) = this;
          local_150 = std::
                      _Function_handler<void_(TorControlConnection_&,_const_TorControlReply_&),_std::_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>_>
                      ::_M_invoke;
          local_158 = std::
                      _Function_handler<void_(TorControlConnection_&,_const_TorControlReply_&),_std::_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>_>
                      ::_M_manager;
          TorControlConnection::Command(_conn,&l.first,(ReplyHandlerCB *)&local_168);
          if (local_158 != (code *)0x0) {
            (*local_158)(&local_168,&local_168,__destroy_functor);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)l.first._M_dataplus._M_p != paVar1) {
            operator_delete(l.first._M_dataplus._M_p,l.first.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_128._0_8_ != local_118) {
            operator_delete((void *)local_128._0_8_,(ulong)(local_118._0_8_ + 1));
          }
        }
        else {
          source_file_07._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
          ;
          source_file_07._M_len = 0x5e;
          logging_function_07._M_str = "protocolinfo_cb";
          logging_function_07._M_len = 0xf;
          LogPrintFormatInternal<std::__cxx11::string,int>
                    (logging_function_07,source_file_07,0x25a,ALL,Info,
                     (ConstevalFormatString<2U>)0xfaef8e,&cookiefile,&TOR_COOKIE_SIZE);
        }
      }
      else {
        source_file_06._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
        ;
        source_file_06._M_len = 0x5e;
        logging_function_06._M_str = "protocolinfo_cb";
        logging_function_06._M_len = 0xf;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_06,source_file_06,0x25c,ALL,Info,
                   (ConstevalFormatString<1U>)0xfaefe1,&cookiefile);
      }
      uVar13 = m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      _Var14._M_p = (pointer)m._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
      if ((_Base_ptr *)m._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ !=
          &m._M_t._M_impl.super__Rb_tree_header._M_header._M_left) goto LAB_00ab1308;
    }
    else {
      pLVar8 = LogInstance();
      bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar8,TOR,Debug);
      if (bVar5) {
        source_file_03._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
        ;
        source_file_03._M_len = 0x5e;
        logging_function_03._M_str = "protocolinfo_cb";
        logging_function_03._M_len = 0xf;
        LogPrintFormatInternal<>
                  (logging_function_03,source_file_03,0x24c,TOR,Debug,
                   (ConstevalFormatString<0U>)0xfaef04);
      }
      l.first._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&l,"AUTHENTICATE","");
      m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      m._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      m._M_t._M_impl._0_8_ = operator_new(0x18);
      *(code **)m._M_t._M_impl._0_8_ = auth_cb;
      *(undefined8 *)(m._M_t._M_impl._0_8_ + 8) = 0;
      *(TorController **)(m._M_t._M_impl._0_8_ + 0x10) = this;
      m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::
           _Function_handler<void_(TorControlConnection_&,_const_TorControlReply_&),_std::_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>_>
           ::_M_invoke;
      m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           std::
           _Function_handler<void_(TorControlConnection_&,_const_TorControlReply_&),_std::_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>_>
           ::_M_manager;
      TorControlConnection::Command(_conn,&l.first,(ReplyHandlerCB *)&m);
      if (m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        (*(code *)m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)(&m,&m,3);
      }
      uVar13 = l.first.field_2._M_allocated_capacity;
      _Var14._M_p = l.first._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)l.first._M_dataplus._M_p != paVar1) {
LAB_00ab1308:
        operator_delete(_Var14._M_p,(ulong)((long)&((_Base_ptr)uVar13)->_M_color + 1));
      }
    }
  }
  else {
    l.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&l,"HASHEDPASSWORD","");
    cVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&local_68,&l.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)l.first._M_dataplus._M_p != paVar1) {
      operator_delete(l.first._M_dataplus._M_p,l.first.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar10._M_node == &local_68._M_impl.super__Rb_tree_header) {
      fmt = 
      "tor: Password provided with -torpassword, but HASHEDPASSWORD authentication is not available\n"
      ;
      iVar6 = 0x249;
LAB_00ab1213:
      source_file_04._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file_04._M_len = 0x5e;
      logging_function_04._M_str = "protocolinfo_cb";
      logging_function_04._M_len = 0xf;
      LogPrintFormatInternal<>
                (logging_function_04,source_file_04,iVar6,ALL,Info,(ConstevalFormatString<0U>)fmt);
    }
    else {
      pLVar8 = LogInstance();
      bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar8,TOR,Debug);
      if (bVar5) {
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
        ;
        source_file_01._M_len = 0x5e;
        logging_function_01._M_str = "protocolinfo_cb";
        logging_function_01._M_len = 0xf;
        LogPrintFormatInternal<>
                  (logging_function_01,source_file_01,0x245,TOR,Debug,
                   (ConstevalFormatString<0U>)0xfaee72);
      }
      l.first._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&l,"\"","");
      m._M_t._M_impl._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&m,"\\\"","");
      util::ReplaceAll(&torpassword,&l.first,(string *)&m);
      if ((_Base_ptr *)m._M_t._M_impl._0_8_ != pp_Var2) {
        operator_delete((void *)m._M_t._M_impl._0_8_,
                        (ulong)((long)&(m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                       _M_color + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)l.first._M_dataplus._M_p != paVar1) {
        operator_delete(l.first._M_dataplus._M_p,l.first.field_2._M_allocated_capacity + 1);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&m,
                     "AUTHENTICATE \"",&torpassword);
      pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&m,"\"")
      ;
      l.first._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
      paVar12 = &pbVar11->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)l.first._M_dataplus._M_p == paVar12) {
        l.first.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        l.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
        l.first._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        l.first.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      l.first._M_string_length = pbVar11->_M_string_length;
      (pbVar11->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar11->_M_string_length = 0;
      (pbVar11->field_2)._M_local_buf[0] = '\0';
      local_128._8_8_ = (_Base_ptr)0x0;
      local_128._0_8_ = operator_new(0x18);
      *(code **)local_128._0_8_ = auth_cb;
      *(char *)(local_128._0_8_ + 8) = '\0';
      *(char *)(local_128._0_8_ + 9) = '\0';
      *(char *)(local_128._0_8_ + 10) = '\0';
      *(char *)(local_128._0_8_ + 0xb) = '\0';
      *(char *)(local_128._0_8_ + 0xc) = '\0';
      *(char *)(local_128._0_8_ + 0xd) = '\0';
      *(char *)(local_128._0_8_ + 0xe) = '\0';
      *(char *)(local_128._0_8_ + 0xf) = '\0';
      *(TorController **)(local_128._0_8_ + 0x10) = this;
      local_118._8_8_ =
           std::
           _Function_handler<void_(TorControlConnection_&,_const_TorControlReply_&),_std::_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>_>
           ::_M_invoke;
      local_118._0_8_ =
           std::
           _Function_handler<void_(TorControlConnection_&,_const_TorControlReply_&),_std::_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>_>
           ::_M_manager;
      TorControlConnection::Command(_conn,&l.first,(ReplyHandlerCB *)local_128);
      if ((code *)local_118._0_8_ != (code *)0x0) {
        (*(code *)local_118._0_8_)(local_128,local_128,3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)l.first._M_dataplus._M_p != paVar1) {
        operator_delete(l.first._M_dataplus._M_p,l.first.field_2._M_allocated_capacity + 1);
      }
      uVar13 = m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      _Var14._M_p = (pointer)m._M_t._M_impl._0_8_;
      if ((_Base_ptr *)m._M_t._M_impl._0_8_ != pp_Var2) goto LAB_00ab1308;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)torpassword._M_dataplus._M_p != &torpassword.field_2) {
    operator_delete(torpassword._M_dataplus._M_p,torpassword.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cookiefile._M_dataplus._M_p != &cookiefile.field_2) {
    operator_delete(cookiefile._M_dataplus._M_p,
                    CONCAT71(cookiefile.field_2._M_allocated_capacity._1_7_,
                             cookiefile.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00ab1b79:
  __stack_chk_fail();
}

Assistant:

void TorController::protocolinfo_cb(TorControlConnection& _conn, const TorControlReply& reply)
{
    if (reply.code == 250) {
        std::set<std::string> methods;
        std::string cookiefile;
        /*
         * 250-AUTH METHODS=COOKIE,SAFECOOKIE COOKIEFILE="/home/x/.tor/control_auth_cookie"
         * 250-AUTH METHODS=NULL
         * 250-AUTH METHODS=HASHEDPASSWORD
         */
        for (const std::string &s : reply.lines) {
            std::pair<std::string,std::string> l = SplitTorReplyLine(s);
            if (l.first == "AUTH") {
                std::map<std::string,std::string> m = ParseTorReplyMapping(l.second);
                std::map<std::string,std::string>::iterator i;
                if ((i = m.find("METHODS")) != m.end()) {
                    std::vector<std::string> m_vec = SplitString(i->second, ',');
                    methods = std::set<std::string>(m_vec.begin(), m_vec.end());
                }
                if ((i = m.find("COOKIEFILE")) != m.end())
                    cookiefile = i->second;
            } else if (l.first == "VERSION") {
                std::map<std::string,std::string> m = ParseTorReplyMapping(l.second);
                std::map<std::string,std::string>::iterator i;
                if ((i = m.find("Tor")) != m.end()) {
                    LogDebug(BCLog::TOR, "Connected to Tor version %s\n", i->second);
                }
            }
        }
        for (const std::string &s : methods) {
            LogDebug(BCLog::TOR, "Supported authentication method: %s\n", s);
        }
        // Prefer NULL, otherwise SAFECOOKIE. If a password is provided, use HASHEDPASSWORD
        /* Authentication:
         *   cookie:   hex-encoded ~/.tor/control_auth_cookie
         *   password: "password"
         */
        std::string torpassword = gArgs.GetArg("-torpassword", "");
        if (!torpassword.empty()) {
            if (methods.count("HASHEDPASSWORD")) {
                LogDebug(BCLog::TOR, "Using HASHEDPASSWORD authentication\n");
                ReplaceAll(torpassword, "\"", "\\\"");
                _conn.Command("AUTHENTICATE \"" + torpassword + "\"", std::bind(&TorController::auth_cb, this, std::placeholders::_1, std::placeholders::_2));
            } else {
                LogPrintf("tor: Password provided with -torpassword, but HASHEDPASSWORD authentication is not available\n");
            }
        } else if (methods.count("NULL")) {
            LogDebug(BCLog::TOR, "Using NULL authentication\n");
            _conn.Command("AUTHENTICATE", std::bind(&TorController::auth_cb, this, std::placeholders::_1, std::placeholders::_2));
        } else if (methods.count("SAFECOOKIE")) {
            // Cookie: hexdump -e '32/1 "%02x""\n"'  ~/.tor/control_auth_cookie
            LogDebug(BCLog::TOR, "Using SAFECOOKIE authentication, reading cookie authentication from %s\n", cookiefile);
            std::pair<bool,std::string> status_cookie = ReadBinaryFile(fs::PathFromString(cookiefile), TOR_COOKIE_SIZE);
            if (status_cookie.first && status_cookie.second.size() == TOR_COOKIE_SIZE) {
                // _conn.Command("AUTHENTICATE " + HexStr(status_cookie.second), std::bind(&TorController::auth_cb, this, std::placeholders::_1, std::placeholders::_2));
                cookie = std::vector<uint8_t>(status_cookie.second.begin(), status_cookie.second.end());
                clientNonce = std::vector<uint8_t>(TOR_NONCE_SIZE, 0);
                GetRandBytes(clientNonce);
                _conn.Command("AUTHCHALLENGE SAFECOOKIE " + HexStr(clientNonce), std::bind(&TorController::authchallenge_cb, this, std::placeholders::_1, std::placeholders::_2));
            } else {
                if (status_cookie.first) {
                    LogPrintf("tor: Authentication cookie %s is not exactly %i bytes, as is required by the spec\n", cookiefile, TOR_COOKIE_SIZE);
                } else {
                    LogPrintf("tor: Authentication cookie %s could not be opened (check permissions)\n", cookiefile);
                }
            }
        } else if (methods.count("HASHEDPASSWORD")) {
            LogPrintf("tor: The only supported authentication mechanism left is password, but no password provided with -torpassword\n");
        } else {
            LogPrintf("tor: No supported authentication method\n");
        }
    } else {
        LogPrintf("tor: Requesting protocol info failed\n");
    }
}